

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O0

Plugin * csm::Plugin::findPlugin(string *pluginName,WarningList *warnings)

{
  Locker this;
  bool bVar1;
  __type _Var2;
  Impl *impl;
  PluginList *this_00;
  reference ppPVar3;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  WarningType local_c4;
  Warning local_c0;
  undefined4 local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Self local_50;
  _Self local_48;
  const_iterator i;
  PluginList *plugins;
  Locker locker;
  WarningList *warnings_local;
  string *pluginName_local;
  
  locker.theImpl = (Impl *)warnings;
  impl = Plugin::impl();
  Impl::Locker::Locker((Locker *)&plugins,impl);
  this_00 = getList_abi_cxx11_();
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_>::begin(this_00)
  ;
  do {
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_>::end(this_00)
    ;
    bVar1 = std::operator!=(&local_48,&local_50);
    this = locker;
    if (!bVar1) {
      if (locker.theImpl != (Impl *)0x0) {
        local_c4 = DATA_NOT_AVAILABLE;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"No matching plugin found",&local_e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"Plugin::findPlugin",&local_111);
        Warning::Warning(&local_c0,&local_c4,&local_e8,&local_110);
        std::__cxx11::list<csm::Warning,_std::allocator<csm::Warning>_>::push_back
                  ((list<csm::Warning,_std::allocator<csm::Warning>_> *)this.theImpl,&local_c0);
        Warning::~Warning(&local_c0);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator(&local_111);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
      }
      pluginName_local = (string *)0x0;
LAB_0014f2a2:
      local_74 = 1;
      Impl::Locker::~Locker((Locker *)&plugins);
      return (Plugin *)pluginName_local;
    }
    ppPVar3 = std::_List_const_iterator<const_csm::Plugin_*>::operator*(&local_48);
    (*(*ppPVar3)->_vptr_Plugin[2])(&local_70);
    _Var2 = std::operator==(pluginName,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (_Var2) {
      ppPVar3 = std::_List_const_iterator<const_csm::Plugin_*>::operator*(&local_48);
      pluginName_local = (string *)*ppPVar3;
      goto LAB_0014f2a2;
    }
    std::_List_const_iterator<const_csm::Plugin_*>::operator++(&local_48);
  } while( true );
}

Assistant:

const Plugin* Plugin::findPlugin(const std:: string& pluginName,
                                 WarningList* warnings)
{
   Impl::Locker locker(impl());

   const PluginList& plugins = getList();

   for (PluginList::const_iterator i = plugins.begin();
        i != plugins.end(); ++i)
   {
      if (pluginName == (*i)->getPluginName())
      {
         return *i;
      }
   }

   // plugin not found
   if (warnings)
   {
      warnings->push_back(Warning(Warning::DATA_NOT_AVAILABLE,
                                  "No matching plugin found",
                                  "Plugin::findPlugin"));
   }

   return NULL;
}